

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level_mesh.cxx
# Opt level: O3

size_t __thiscall
level_mesh::assign_contact_groups
          (level_mesh *this,b_submesh_vec *submeshes,b_collision_vec *contacts,
          b_submesh_vec *orphans)

{
  pointer ppVar1;
  pointer ppVar2;
  pair<b_submesh_*,_b_submesh_*> *ppVar3;
  iterator __position;
  long lVar4;
  ulong uVar5;
  __normal_iterator<std::pair<b_submesh_*,_b_submesh_*>_*,_std::vector<std::pair<b_submesh_*,_b_submesh_*>,_std::allocator<std::pair<b_submesh_*,_b_submesh_*>_>_>_>
  _Var6;
  size_t sVar7;
  pointer ppbVar8;
  pointer ppbVar9;
  uint32_t uVar10;
  size_t sVar11;
  b_submesh *sm;
  b_submesh_vec adjacents;
  b_submesh *sm1;
  b_collision contact;
  b_submesh *local_80;
  vector<b_submesh_*,_std::allocator<b_submesh_*>_> local_78;
  pointer local_60;
  pointer local_58;
  vector<b_submesh*,std::allocator<b_submesh*>> *local_50;
  b_submesh *local_48;
  b_submesh *local_40;
  undefined8 local_38;
  
  ppVar1 = (contacts->
           super__Vector_base<std::pair<b_submesh_*,_b_submesh_*>,_std::allocator<std::pair<b_submesh_*,_b_submesh_*>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  ppVar2 = (contacts->
           super__Vector_base<std::pair<b_submesh_*,_b_submesh_*>,_std::allocator<std::pair<b_submesh_*,_b_submesh_*>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  local_50 = (vector<b_submesh*,std::allocator<b_submesh*>> *)orphans;
  if (ppVar1 != ppVar2) {
    uVar5 = (long)ppVar2 - (long)ppVar1 >> 4;
    lVar4 = 0x3f;
    if (uVar5 != 0) {
      for (; uVar5 >> lVar4 == 0; lVar4 = lVar4 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<std::pair<b_submesh*,b_submesh*>*,std::vector<std::pair<b_submesh*,b_submesh*>,std::allocator<std::pair<b_submesh*,b_submesh*>>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (ppVar1,ppVar2,((uint)lVar4 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<std::pair<b_submesh*,b_submesh*>*,std::vector<std::pair<b_submesh*,b_submesh*>,std::allocator<std::pair<b_submesh*,b_submesh*>>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (ppVar1,ppVar2);
  }
  local_78.super__Vector_base<b_submesh_*,_std::allocator<b_submesh_*>_>._M_impl.
  super__Vector_impl_data._M_start = (b_submesh **)0x0;
  local_78.super__Vector_base<b_submesh_*,_std::allocator<b_submesh_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (b_submesh **)0x0;
  local_78.super__Vector_base<b_submesh_*,_std::allocator<b_submesh_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (b_submesh **)0x0;
  std::vector<b_submesh_*,_std::allocator<b_submesh_*>_>::reserve(&local_78,0x80);
  ppbVar8 = (submeshes->super__Vector_base<b_submesh_*,_std::allocator<b_submesh_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  ppbVar9 = (submeshes->super__Vector_base<b_submesh_*,_std::allocator<b_submesh_*>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  sVar11 = 0;
  if (ppbVar8 != ppbVar9) {
    local_60 = ppbVar9;
    do {
      local_80 = *ppbVar8;
      if (local_80 == (b_submesh *)0x0) {
        __assert_fail("sm",
                      "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/utils/converter/level_mesh.cxx"
                      ,0x1c6,
                      "size_t level_mesh::assign_contact_groups(b_submesh_vec &, b_collision_vec &, b_submesh_vec &)"
                     );
      }
      if (local_80->group == 0xffffffff) {
        uVar10 = (uint32_t)sVar11;
        local_80->group = uVar10;
        sVar7 = (local_80->super_b_model_instance).num_faces;
        local_58 = ppbVar8;
        while( true ) {
          local_38 = 0;
          ppVar3 = (contacts->
                   super__Vector_base<std::pair<b_submesh_*,_b_submesh_*>,_std::allocator<std::pair<b_submesh_*,_b_submesh_*>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
          local_40 = local_80;
          for (_Var6 = std::
                       __lower_bound<__gnu_cxx::__normal_iterator<std::pair<b_submesh*,b_submesh*>*,std::vector<std::pair<b_submesh*,b_submesh*>,std::allocator<std::pair<b_submesh*,b_submesh*>>>>,std::pair<b_submesh*,b_submesh*>,__gnu_cxx::__ops::_Iter_less_val>
                                 ((contacts->
                                  super__Vector_base<std::pair<b_submesh_*,_b_submesh_*>,_std::allocator<std::pair<b_submesh_*,_b_submesh_*>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start,ppVar3,&local_40);
              (ppbVar8 = local_58, ppbVar9 = local_60, _Var6._M_current != ppVar3 &&
              (local_80 == (_Var6._M_current)->first)); _Var6._M_current = _Var6._M_current + 1) {
            local_48 = (_Var6._M_current)->second;
            if (local_48->group == 0xffffffff) {
              local_48->group = uVar10;
              if (local_78.super__Vector_base<b_submesh_*,_std::allocator<b_submesh_*>_>._M_impl.
                  super__Vector_impl_data._M_finish ==
                  local_78.super__Vector_base<b_submesh_*,_std::allocator<b_submesh_*>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<b_submesh*,std::allocator<b_submesh*>>::
                _M_realloc_insert<b_submesh*const&>
                          ((vector<b_submesh*,std::allocator<b_submesh*>> *)&local_78,
                           (iterator)
                           local_78.super__Vector_base<b_submesh_*,_std::allocator<b_submesh_*>_>.
                           _M_impl.super__Vector_impl_data._M_finish,&local_48);
              }
              else {
                *local_78.super__Vector_base<b_submesh_*,_std::allocator<b_submesh_*>_>._M_impl.
                 super__Vector_impl_data._M_finish = local_48;
                local_78.super__Vector_base<b_submesh_*,_std::allocator<b_submesh_*>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     local_78.super__Vector_base<b_submesh_*,_std::allocator<b_submesh_*>_>._M_impl.
                     super__Vector_impl_data._M_finish + 1;
              }
            }
          }
          if (local_78.super__Vector_base<b_submesh_*,_std::allocator<b_submesh_*>_>._M_impl.
              super__Vector_impl_data._M_start ==
              local_78.super__Vector_base<b_submesh_*,_std::allocator<b_submesh_*>_>._M_impl.
              super__Vector_impl_data._M_finish) break;
          local_80 = local_78.super__Vector_base<b_submesh_*,_std::allocator<b_submesh_*>_>._M_impl.
                     super__Vector_impl_data._M_finish[-1];
          local_78.super__Vector_base<b_submesh_*,_std::allocator<b_submesh_*>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_78.super__Vector_base<b_submesh_*,_std::allocator<b_submesh_*>_>._M_impl.
               super__Vector_impl_data._M_finish + -1;
          sVar7 = sVar7 + (local_80->super_b_model_instance).num_faces;
        }
        if (sVar7 < 2) {
          *local_58 = (b_submesh *)0x0;
          __position._M_current = *(b_submesh ***)(local_50 + 8);
          if (__position._M_current == *(b_submesh ***)(local_50 + 0x10)) {
            std::vector<b_submesh*,std::allocator<b_submesh*>>::_M_realloc_insert<b_submesh*const&>
                      (local_50,__position,&local_80);
          }
          else {
            *__position._M_current = local_80;
            *(long *)(local_50 + 8) = *(long *)(local_50 + 8) + 8;
          }
        }
        else {
          sVar11 = (size_t)(uVar10 + 1);
        }
      }
      ppbVar8 = ppbVar8 + 1;
    } while (ppbVar8 != ppbVar9);
  }
  ppVar1 = (contacts->
           super__Vector_base<std::pair<b_submesh_*,_b_submesh_*>,_std::allocator<std::pair<b_submesh_*,_b_submesh_*>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  ppVar2 = (contacts->
           super__Vector_base<std::pair<b_submesh_*,_b_submesh_*>,_std::allocator<std::pair<b_submesh_*,_b_submesh_*>_>_>
           )._M_impl.super__Vector_impl_data._M_end_of_storage;
  (contacts->
  super__Vector_base<std::pair<b_submesh_*,_b_submesh_*>,_std::allocator<std::pair<b_submesh_*,_b_submesh_*>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (contacts->
  super__Vector_base<std::pair<b_submesh_*,_b_submesh_*>,_std::allocator<std::pair<b_submesh_*,_b_submesh_*>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (contacts->
  super__Vector_base<std::pair<b_submesh_*,_b_submesh_*>,_std::allocator<std::pair<b_submesh_*,_b_submesh_*>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (ppVar1 != (pointer)0x0) {
    operator_delete(ppVar1,(long)ppVar2 - (long)ppVar1);
  }
  if (local_78.super__Vector_base<b_submesh_*,_std::allocator<b_submesh_*>_>._M_impl.
      super__Vector_impl_data._M_start != (b_submesh **)0x0) {
    operator_delete(local_78.super__Vector_base<b_submesh_*,_std::allocator<b_submesh_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_78.super__Vector_base<b_submesh_*,_std::allocator<b_submesh_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.super__Vector_base<b_submesh_*,_std::allocator<b_submesh_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return sVar11;
}

Assistant:

size_t level_mesh::assign_contact_groups(b_submesh_vec& submeshes, b_collision_vec& contacts,
		b_submesh_vec& orphans)
{
	std::sort(contacts.begin(), contacts.end());
	b_submesh_vec adjacents;
	adjacents.reserve(128);
	uint32_t group = 0;
	for (b_submesh_vec_it it = submeshes.begin(), end = submeshes.end(); it != end; ++it) {
		b_submesh* sm = *it;
		xr_assert(sm);
		if (sm->group != BAD_IDX)
			continue;
		sm->group = group;
		size_t num_faces = sm->num_faces;
		for (;;) {
#if defined(_MSC_VER) && _MSC_VER >= 1600
			b_collision contact(sm, nullptr);
#else
			b_collision contact(sm, 0);
#endif
			for (b_collision_vec_it end1 = contacts.end(),
					it1 = std::lower_bound(contacts.begin(), end1, contact);
					it1 != end1 && sm == it1->first; ++it1) {
				b_submesh* sm1 = it1->second;
				if (sm1->group == BAD_IDX) {
					sm1->group = group;
					adjacents.push_back(sm1);
				}
			}
			if (adjacents.empty())
				break;
			sm = adjacents.back();
			adjacents.pop_back();
			num_faces += sm->num_faces;
		}
		if (num_faces > 1) {
			++group;
		} else {
			*it = 0;
			orphans.push_back(sm);
		}
	}
	b_collision_vec().swap(contacts);
	return size_t(group);
}